

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O0

_Bool al_set_audio_stream_channel_matrix(ALLEGRO_AUDIO_STREAM *stream,float *matrix)

{
  char *in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  if ((*(long *)(in_RDI + 0xf8) == 0) || ((*(byte *)(in_RDI + 0x100) & 1) == 0)) {
    local_1 = al_set_sample_instance_channel_matrix(&stream->spl,matrix);
  }
  else {
    _al_set_error((int)((ulong)in_RDI >> 0x20),in_RSI);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_set_audio_stream_channel_matrix(ALLEGRO_AUDIO_STREAM *stream, const float *matrix)
{
   ASSERT(stream);

   if (stream->spl.parent.u.ptr && stream->spl.parent.is_voice) {
      _al_set_error(ALLEGRO_GENERIC_ERROR,
         "Could not set channel matrix of stream attached to voice");
      return false;
   }

   return al_set_sample_instance_channel_matrix(&stream->spl, matrix);
}